

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<kj::String,char_const*,char_const(&)[2],int,char_const(&)[3],kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String>
          (String *__return_storage_ptr__,kj *this,String *params,char **params_1,
          char (*params_2) [2],int *params_3,char (*params_4) [3],Type *params_5,char **params_6,
          StringPtr *params_7,char **params_8,String *params_9,String *params_10)

{
  long lVar1;
  ArrayPtr<const_char> *params_10_00;
  char *pcVar2;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  long local_68;
  char *local_60;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  lVar1 = *(long *)(this + 8);
  local_68 = lVar1;
  if (lVar1 != 0) {
    local_68 = *(long *)this;
  }
  local_60 = (char *)(lVar1 + -1);
  if (lVar1 == 0) {
    local_60 = (char *)0x0;
  }
  local_78 = toCharSequence<char_const*>((char **)params);
  local_88 = toCharSequence<char_const(&)[2]>((char (*) [2])params_1);
  toCharSequence<int>(&local_48,(int *)params_2);
  local_98 = toCharSequence<char_const(&)[3]>((char (*) [3])params_3);
  local_a8 = (ArrayPtr<const_char>)toCharSequence<kj::Exception::Type>((Type *)params_4);
  local_b8 = toCharSequence<char_const*>((char **)params_5);
  local_c8.ptr = *params_6;
  local_c8.size_ = (size_t)(params_6[1] + -1);
  local_d8 = toCharSequence<char_const*>((char **)params_7);
  if (params_8[1] == (char *)0x0) {
    params_10_00 = (ArrayPtr<const_char> *)0x0;
  }
  else {
    params_10_00 = (ArrayPtr<const_char> *)*params_8;
  }
  pcVar2 = (char *)(params_9->content).size_;
  local_58.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_58.ptr = (params_9->content).ptr;
  }
  local_58.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_58.size_ = (size_t)(char *)0x0;
  }
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)&local_98,&local_a8,
             (StringPtr *)&local_b8,&local_c8,&local_d8,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff18,&local_58,params_10_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}